

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O2

bool aedit_climate(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  int iVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  uint uVar3;
  long lVar4;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  char *local_2488 [2];
  string buffer;
  string local_2458;
  char wcli [4608];
  char hold [4608];
  
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  pvVar1 = ch->desc->pEdit;
  one_argument(argument,wcli);
  iVar2 = aclimate_lookup(wcli);
  if (iVar2 < 0) {
    fmt.size_ = 0xc;
    fmt.data_ = (char *)0x1c;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_2488;
    local_2488[0] = wcli;
    ::fmt::v9::vformat_abi_cxx11_(&local_2458,(v9 *)"{} is not a valid climate.\n\r",fmt,args);
    std::__cxx11::string::operator=((string *)&buffer,(string *)&local_2458);
    std::__cxx11::string::~string((string *)&local_2458);
    send_to_char(buffer._M_dataplus._M_p,ch);
    send_to_char("The following climates are available:\n\r",ch);
    lVar4 = -0x438;
    uVar3 = 0;
    while( true ) {
      if (lVar4 == 0) break;
      if (*(long *)(&UNK_004eacf8 + lVar4) == 0) {
        if (uVar3 % 3 != 0) {
          send_to_char("\n\r",ch);
        }
        break;
      }
      sprintf(hold,"%s ");
      if ((char)((ulong)uVar3 % 3) == '\0') {
        fmt_00.size_ = 0xc;
        fmt_00.data_ = (char *)0x4;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)local_2488;
        local_2488[0] = hold;
        ::fmt::v9::vformat_abi_cxx11_(&local_2458,(v9 *)0x3fa11e,fmt_00,args_00);
        std::__cxx11::string::operator=((string *)&buffer,(string *)&local_2458);
        std::__cxx11::string::~string((string *)&local_2458);
      }
      send_to_char(buffer._M_dataplus._M_p,ch);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x78;
    }
  }
  else {
    *(short *)((long)pvVar1 + 0x158) = (short)iVar2;
    send_to_char("Climate set.\n\r",ch);
  }
  std::__cxx11::string::~string((string *)&buffer);
  return -1 < iVar2;
}

Assistant:

bool aedit_climate(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	std::string buffer;
	char wcli[MSL];
	char hold[MSL];
	int icli = 0, climate;

	EDIT_AREA(ch, pArea);

	one_argument(argument, wcli);

	icli = aclimate_lookup(wcli);

	if (icli < 0)
	{
		buffer = fmt::format("{} is not a valid climate.\n\r", wcli);
		send_to_char(buffer.c_str(), ch);
		send_to_char("The following climates are available:\n\r", ch);

		for (climate = 0; climate < Climate::MaxClimate; climate++)
		{
			if (climate_table[climate].name == nullptr)
				break;

			sprintf(hold, "%s ", climate_table[climate].name);

			if (climate % 3 == 0)
				buffer = fmt::format("{}\n\r", hold);

			send_to_char(buffer.c_str(), ch);
		}

		if (climate % 3 != 0)
			send_to_char("\n\r", ch);

		return false;
	}
	else
	{
		pArea->climate = icli;
		send_to_char("Climate set.\n\r", ch);
		return true;
	}
}